

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,EnumDescriptor *enum_descriptor,bool qualified)

{
  string *result;
  string local_30;
  
  if (*(cpp **)(this + 0x18) == (cpp *)0x0) {
    if ((char)enum_descriptor == '\0') {
      std::__cxx11::string::string((string *)__return_storage_ptr__,*(string **)this);
    }
    else {
      anon_unknown_0::DotsToColons(&local_30,*(string **)(this + 8));
      std::operator+(__return_storage_ptr__,"::",&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  else {
    ClassName_abi_cxx11_
              (__return_storage_ptr__,*(cpp **)(this + 0x18),
               (Descriptor *)((ulong)enum_descriptor & 0xff),qualified);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const EnumDescriptor* enum_descriptor, bool qualified) {
  if (enum_descriptor->containing_type() == NULL) {
    if (qualified) {
      return "::" + DotsToColons(enum_descriptor->full_name());
    } else {
      return enum_descriptor->name();
    }
  } else {
    string result = ClassName(enum_descriptor->containing_type(), qualified);
    result += '_';
    result += enum_descriptor->name();
    return result;
  }
}